

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::
getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapTypeGeneratorImpl *this,Shareability share)

{
  Index IVar1;
  Index IVar2;
  reference pvVar3;
  reference __ptr;
  add_pointer_t<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind> ptVar4;
  bool bVar5;
  Entry local_68;
  value_type local_58 [3];
  Entry local_40;
  uintptr_t local_30;
  uint local_28;
  uint local_24;
  Index end;
  Index i;
  HeapTypeGeneratorImpl *pHStack_18;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *candidates;
  
  end._3_1_ = 0;
  i = share;
  pHStack_18 = this;
  this_local = (HeapTypeGeneratorImpl *)__return_storage_ptr__;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(__return_storage_ptr__);
  local_24 = 0;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->recGroupEnds,(ulong)this->index);
  local_28 = *pvVar3;
  for (; local_24 < local_28; local_24 = local_24 + 1) {
    __ptr = std::
            vector<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
            ::operator[](&this->typeKinds,(ulong)local_24);
    ptVar4 = std::
             get_if<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                       (__ptr);
    IVar1 = i;
    bVar5 = false;
    if (ptVar4 != (add_pointer_t<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>)0x0
       ) {
      local_40 = TypeBuilder::operator[](this->builder,(ulong)local_24);
      local_30 = (uintptr_t)TypeBuilder::Entry::operator_cast_to_HeapType(&local_40);
      IVar2 = wasm::HeapType::getShared();
      bVar5 = IVar1 == IVar2;
    }
    if (bVar5) {
      local_68 = TypeBuilder::operator[](this->builder,(ulong)local_24);
      local_58[0].id = (uintptr_t)TypeBuilder::Entry::operator_cast_to_HeapType(&local_68);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (__return_storage_ptr__,local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getKindCandidates(Shareability share) {
    std::vector<HeapType> candidates;
    // Iterate through the top level kinds, finding matches for `Kind`. Since we
    // are constructing a child, we can only look through the end of the current
    // recursion group.
    for (Index i = 0, end = recGroupEnds[index]; i < end; ++i) {
      if (std::get_if<Kind>(&typeKinds[i]) &&
          share == HeapType(builder[i]).getShared()) {
        candidates.push_back(builder[i]);
      }
    }
    return candidates;
  }